

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YeeSolver.h
# Opt level: O3

void pica::YeeSolver::Implementation<(pica::Dimension)3,_double>::updateB
               (YeeGrid<(pica::Dimension)3,_double> *grid,double dt)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  pointer pdVar10;
  double *pdVar11;
  int iVar12;
  pointer pdVar13;
  double *pdVar14;
  int iVar15;
  long lVar16;
  pointer pdVar17;
  long lVar18;
  pointer pdVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  double *pdVar23;
  pointer pdVar24;
  int iVar25;
  long lVar26;
  pointer pdVar27;
  pointer pdVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  double *pdVar32;
  long lVar33;
  ulong uVar34;
  double *pdVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  uint local_94;
  int local_78;
  
  dVar36 = dt * 29979245800.0;
  dVar37 = dVar36 / (grid->super_Grid<(pica::Dimension)3,_double>).step.y;
  dVar38 = dVar36 / (grid->super_Grid<(pica::Dimension)3,_double>).step.z;
  uVar2._0_4_ = (grid->super_Grid<(pica::Dimension)3,_double>).exData.size.x;
  uVar2._4_4_ = (grid->super_Grid<(pica::Dimension)3,_double>).exData.size.y;
  uVar1 = (grid->super_Grid<(pica::Dimension)3,_double>).exData.size.z;
  lVar7 = (long)(int)uVar1;
  if (1 < (int)(undefined4)uVar2) {
    dVar36 = dVar36 / (grid->super_Grid<(pica::Dimension)3,_double>).step.x;
    lVar18 = lVar7 * 8;
    local_94 = 1;
    iVar3 = 0;
    do {
      if (1 < (int)uVar2._4_4_) {
        iVar12 = (grid->super_Grid<(pica::Dimension)3,_double>).eyData.size.y;
        lVar5 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).eyData.size.z;
        iVar30 = (grid->super_Grid<(pica::Dimension)3,_double>).ezData.size.y;
        lVar8 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).ezData.size.z;
        lVar26 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).bxData.size.z;
        pdVar24 = (grid->super_Grid<(pica::Dimension)3,_double>).exData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar31 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).byData.size.z;
        lVar33 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).bzData.size.z;
        pdVar28 = (grid->super_Grid<(pica::Dimension)3,_double>).bzData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start +
                  ((long)(int)((grid->super_Grid<(pica::Dimension)3,_double>).bzData.size.y *
                              local_94) + 1) * lVar33 + 1;
        lVar21 = (long)(int)((grid->super_Grid<(pica::Dimension)3,_double>).exData.size.y * local_94
                            );
        lVar29 = (long)pdVar24 + lVar18 * lVar21 + 8;
        pdVar13 = (grid->super_Grid<(pica::Dimension)3,_double>).byData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start +
                  ((long)(int)((grid->super_Grid<(pica::Dimension)3,_double>).byData.size.y *
                              local_94) + 1) * lVar31 + 1;
        lVar6 = (long)pdVar24 + (lVar21 + 1) * lVar18 + 8;
        pdVar27 = (grid->super_Grid<(pica::Dimension)3,_double>).bxData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start +
                  ((long)(int)((grid->super_Grid<(pica::Dimension)3,_double>).bxData.size.y *
                              local_94) + 1) * lVar26 + 1;
        lVar16 = (long)(int)(iVar30 * local_94);
        pdVar24 = (grid->super_Grid<(pica::Dimension)3,_double>).ezData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar19 = pdVar24 + ((long)(iVar30 * iVar3) + 1) * lVar8 + 1;
        lVar21 = (long)pdVar24 + lVar8 * 8 * lVar16 + 8;
        pdVar24 = pdVar24 + (lVar16 + 1) * lVar8 + 1;
        pdVar10 = (grid->super_Grid<(pica::Dimension)3,_double>).eyData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar17 = pdVar10 + ((long)(iVar12 * iVar3) + 1) * lVar5 + 1;
        pdVar10 = pdVar10 + ((long)(int)(iVar12 * local_94) + 1) * lVar5 + 1;
        uVar34 = 1;
        do {
          if (1 < (int)uVar1) {
            lVar16 = 0;
            do {
              *(double *)((long)pdVar27 + lVar16) =
                   (*(double *)((long)pdVar10 + lVar16) - *(double *)((long)pdVar10 + lVar16 + -8))
                   * dVar38 +
                   (*(double *)((long)pdVar24 + lVar16) - *(double *)(lVar21 + lVar16)) * -dVar37 +
                   *(double *)((long)pdVar27 + lVar16);
              *(double *)((long)pdVar13 + lVar16) =
                   (*(double *)((long)pdVar24 + lVar16) - *(double *)((long)pdVar19 + lVar16)) *
                   dVar36 + (*(double *)(lVar6 + lVar16) - *(double *)(lVar6 + lVar16 + -8)) *
                            -dVar38 + *(double *)((long)pdVar13 + lVar16);
              *(double *)((long)pdVar28 + lVar16) =
                   (*(double *)(lVar6 + lVar16) - *(double *)(lVar29 + lVar16)) * dVar37 +
                   (*(double *)((long)pdVar10 + lVar16) - *(double *)((long)pdVar17 + lVar16)) *
                   -dVar36 + *(double *)((long)pdVar28 + lVar16);
              lVar16 = lVar16 + 8;
            } while ((ulong)uVar1 * 8 + -8 != lVar16);
          }
          uVar34 = uVar34 + 1;
          pdVar28 = pdVar28 + lVar33;
          pdVar17 = pdVar17 + lVar5;
          lVar29 = lVar29 + lVar7 * 8;
          pdVar13 = pdVar13 + lVar31;
          lVar6 = lVar6 + lVar7 * 8;
          pdVar19 = pdVar19 + lVar8;
          pdVar27 = pdVar27 + lVar26;
          lVar21 = lVar21 + lVar8 * 8;
          pdVar24 = pdVar24 + lVar8;
          pdVar10 = pdVar10 + lVar5;
        } while (uVar34 != uVar2 >> 0x20);
      }
      local_94 = local_94 + 1;
      iVar3 = iVar3 + 1;
    } while (local_94 != (undefined4)uVar2);
    if (1 < (int)(undefined4)uVar2) {
      lVar16 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).exData.size.y;
      lVar21 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).eyData.size.y;
      lVar5 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).eyData.size.z;
      pdVar17 = (grid->super_Grid<(pica::Dimension)3,_double>).exData.data.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pdVar13 = (grid->super_Grid<(pica::Dimension)3,_double>).eyData.data.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      lVar6 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).bzData.size.y;
      lVar8 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).bzData.size.z;
      lVar26 = lVar16 * lVar7;
      pdVar24 = pdVar17 + (lVar16 + 1) * lVar7;
      pdVar10 = pdVar13 + (lVar21 + 1) * lVar5;
      lVar21 = lVar21 * lVar5;
      pdVar13 = pdVar13 + lVar5;
      pdVar9 = (grid->super_Grid<(pica::Dimension)3,_double>).bzData.data.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start + (lVar6 + 1) * lVar8;
      uVar34 = 1;
      do {
        pdVar17 = pdVar17 + lVar26;
        if (1 < (int)uVar2._4_4_) {
          lVar29 = 0;
          lVar16 = 0;
          pdVar14 = pdVar9;
          lVar7 = (uVar2 >> 0x20) - 1;
          do {
            *pdVar14 = (*(double *)((long)pdVar24 + lVar16) - *(double *)((long)pdVar17 + lVar16)) *
                       dVar37 + (*(double *)((long)pdVar10 + lVar29) -
                                *(double *)((long)pdVar13 + lVar29)) * -dVar36 + *pdVar14;
            lVar16 = lVar16 + lVar18;
            lVar29 = lVar29 + lVar5 * 8;
            pdVar14 = pdVar14 + lVar8;
            lVar7 = lVar7 + -1;
          } while (lVar7 != 0);
        }
        uVar34 = uVar34 + 1;
        pdVar24 = pdVar24 + lVar26;
        pdVar10 = pdVar10 + lVar21;
        pdVar13 = pdVar13 + lVar21;
        pdVar9 = pdVar9 + lVar6 * lVar8;
      } while (uVar34 != ((undefined4)uVar2 & 0x7fffffff));
      if (1 < (int)(undefined4)uVar2) {
        pdVar24 = (grid->super_Grid<(pica::Dimension)3,_double>).ezData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar10 = (grid->super_Grid<(pica::Dimension)3,_double>).exData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar15 = (grid->super_Grid<(pica::Dimension)3,_double>).byData.size.y *
                 (grid->super_Grid<(pica::Dimension)3,_double>).byData.size.z;
        pdVar13 = (grid->super_Grid<(pica::Dimension)3,_double>).byData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar22 = (grid->super_Grid<(pica::Dimension)3,_double>).exData.size.y * uVar1;
        iVar4 = (grid->super_Grid<(pica::Dimension)3,_double>).ezData.size.z *
                (grid->super_Grid<(pica::Dimension)3,_double>).ezData.size.y;
        uVar34 = 1;
        iVar25 = 0;
        iVar3 = iVar4;
        iVar12 = iVar22;
        iVar30 = iVar15;
        do {
          if (1 < (int)uVar1) {
            uVar20 = 1;
            do {
              pdVar13[(long)iVar30 + uVar20] =
                   (pdVar24[(long)iVar3 + uVar20] - pdVar24[(long)iVar25 + uVar20]) * dVar36 +
                   (pdVar10[(long)iVar12 + uVar20] - pdVar10[(long)iVar12 + (uVar20 - 1)]) * -dVar38
                   + pdVar13[(long)iVar30 + uVar20];
              uVar20 = uVar20 + 1;
            } while (uVar1 != uVar20);
          }
          uVar34 = uVar34 + 1;
          iVar30 = iVar30 + iVar15;
          iVar12 = iVar12 + iVar22;
          iVar25 = iVar25 + iVar4;
          iVar3 = iVar3 + iVar4;
        } while (uVar34 != ((undefined4)uVar2 & 0x7fffffff));
      }
    }
  }
  if (1 < (int)uVar2._4_4_) {
    lVar7 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).eyData.size.z;
    iVar3 = (grid->super_Grid<(pica::Dimension)3,_double>).ezData.size.z;
    lVar18 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).bxData.size.z;
    pdVar14 = (grid->super_Grid<(pica::Dimension)3,_double>).eyData.data.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start + lVar7 + 1;
    pdVar23 = (grid->super_Grid<(pica::Dimension)3,_double>).bxData.data.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start + lVar18 + 1;
    pdVar9 = (grid->super_Grid<(pica::Dimension)3,_double>).ezData.data.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start + 1;
    uVar34 = 1;
    do {
      pdVar11 = pdVar9;
      lVar21 = (ulong)uVar1 - 1;
      pdVar32 = pdVar23;
      pdVar35 = pdVar14;
      if (1 < (int)uVar1) {
        do {
          *pdVar32 = (*pdVar35 - pdVar35[-1]) * dVar38 + (pdVar11[iVar3] - *pdVar11) * -dVar37 +
                     *pdVar32;
          pdVar35 = pdVar35 + 1;
          pdVar32 = pdVar32 + 1;
          pdVar11 = pdVar11 + 1;
          lVar21 = lVar21 + -1;
        } while (lVar21 != 0);
      }
      uVar34 = uVar34 + 1;
      pdVar14 = pdVar14 + lVar7;
      pdVar23 = pdVar23 + lVar18;
      pdVar9 = pdVar9 + iVar3;
    } while (uVar34 != uVar2 >> 0x20);
  }
  return;
}

Assistant:

static void updateB(YeeGrid<Three, Real>& grid, Real dt)
    {
        typedef typename YeeGrid<Three, Real>::ValueType ValueType;
        typedef typename YeeGrid<Three, Real>::PositionType PositionType;
        const ValueType cdt = Constants<ValueType>::c() * dt;
        const PositionType coeff = PositionType(cdt, cdt, cdt) / grid.getStep();
        typedef typename YeeGrid<Three, Real>::IndexType IndexType;
        const IndexType begin(1, 1, 1);
        const IndexType end = grid.getSize();
        #pragma omp parallel for collapse(2)
        for (int i = begin.x; i < end.x; i++)
        for (int j = begin.y; j < end.y; j++)
        for (int k = begin.z; k < end.z; k++) {
            grid.bx(i, j, k) += coeff.z * (grid.ey(i, j, k) - grid.ey(i, j, k - 1)) -
                coeff.y * (grid.ez(i, j, k) - grid.ez(i, j - 1, k));
            grid.by(i, j, k) += coeff.x * (grid.ez(i, j, k) - grid.ez(i - 1, j, k)) -
                coeff.z * (grid.ex(i, j, k) - grid.ex(i, j, k - 1));
            grid.bz(i, j, k) += coeff.y * (grid.ex(i, j, k) - grid.ex(i, j - 1, k)) -
                coeff.x * (grid.ey(i, j, k) - grid.ey(i - 1, j, k));
        }
        // Edges
        #pragma omp parallel for
        for (int i = begin.x; i < end.x; i++)
        for (int j = begin.y; j < end.y; j++)
            grid.bz(i, j, 0) += coeff.y * (grid.ex(i, j, 0) - grid.ex(i, j - 1, 0)) -
                coeff.x * (grid.ey(i, j, 0) - grid.ey(i - 1, j, 0));
        #pragma omp parallel for
        for (int i = begin.x; i < end.x; i++)
        for (int k = begin.z; k < end.z; k++)
            grid.by(i, 0, k) += coeff.x * (grid.ez(i, 0, k) - grid.ez(i - 1, 0, k)) -
                coeff.z * (grid.ex(i, 0, k) - grid.ex(i, 0, k - 1));
        #pragma omp parallel for
        for (int j = begin.y; j < end.y; j++)
        for (int k = begin.z; k < end.z; k++)
            grid.bx(0, j, k) += coeff.z * (grid.ey(0, j, k) - grid.ey(0, j, k - 1)) -
                coeff.y * (grid.ez(0, j, k) - grid.ez(0, j - 1, k));
    }